

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.c
# Opt level: O2

int WebRtcIsac_GetCrc(int16_t *bitstream,int len_bitstream_in_bytes,uint32_t *crc)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (bitstream != (int16_t *)0x0) {
    uVar1 = 0;
    uVar3 = (ulong)(uint)len_bitstream_in_bytes;
    if (len_bitstream_in_bytes < 1) {
      uVar3 = uVar1;
    }
    uVar2 = 0xffffffffffffffff;
    for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
      uVar2 = (ulong)((uint)uVar2 << 8 ^
                     kCrcTable[(uint)*(byte *)((long)bitstream + uVar1) ^
                               (uint)(uVar2 >> 0x18) & 0xff]);
    }
    *crc = ~(uint)uVar2;
    return 0;
  }
  return -1;
}

Assistant:

int WebRtcIsac_GetCrc(const int16_t* bitstream,
                      int len_bitstream_in_bytes,
                      uint32_t* crc)
{
  uint8_t* bitstream_ptr_uw8;
  uint32_t crc_state;
  int byte_cntr;
  int crc_tbl_indx;

  /* Sanity Check. */
  if (bitstream == NULL) {
    return -1;
  }
  /* cast to UWord8 pointer */
  bitstream_ptr_uw8 = (uint8_t *)bitstream;

  /* initialize */
  crc_state = 0xFFFFFFFF;

  for (byte_cntr = 0; byte_cntr < len_bitstream_in_bytes; byte_cntr++) {
    crc_tbl_indx = (WEBRTC_SPL_RSHIFT_U32(crc_state, 24) ^
                       bitstream_ptr_uw8[byte_cntr]) & 0xFF;
    crc_state = (crc_state << 8) ^ kCrcTable[crc_tbl_indx];
  }

  *crc = ~crc_state;
  return 0;
}